

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void columnMallocFailure(sqlite3_stmt *pStmt)

{
  uint uVar1;
  sqlite3 *db;
  
  if (pStmt != (sqlite3_stmt *)0x0) {
    db = *(sqlite3 **)pStmt;
    if ((*(uint *)(pStmt + 0x38) == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      db = *(sqlite3 **)pStmt;
      uVar1 = 7;
    }
    else {
      uVar1 = *(uint *)(pStmt + 0x38) & db->errMask;
    }
    *(uint *)(pStmt + 0x38) = uVar1;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      return;
    }
  }
  return;
}

Assistant:

static void columnMallocFailure(sqlite3_stmt *pStmt)
{
  /* If malloc() failed during an encoding conversion within an
  ** sqlite3_column_XXX API, then set the return code of the statement to
  ** SQLITE_NOMEM. The next call to _step() (if any) will return SQLITE_ERROR
  ** and _finalize() will return NOMEM.
  */
  Vdbe *p = (Vdbe *)pStmt;
  if( p ){
    assert( p->db!=0 );
    assert( sqlite3_mutex_held(p->db->mutex) );
    p->rc = sqlite3ApiExit(p->db, p->rc);
    sqlite3_mutex_leave(p->db->mutex);
  }
}